

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test3DTileYsResource_Test::TestBody
          (CTestGen9Resource_Test3DTileYsResource_Test *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  GMM_RESOURCE_INFO *pGVar3;
  uint32_t *puVar4;
  long lVar5;
  uint *puVar6;
  int *piVar7;
  undefined8 *puVar8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined5 local_48;
  undefined1 auStack_43 [11];
  undefined8 local_38;
  
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_38 = 0;
  local_b0 = 3;
  auStack_43 = SUB1611((undefined1  [16])0x0,5);
  local_48 = 0x100000000;
  local_a0 = 0x5000000000;
  local_a8 = 0x400000000;
  puVar4 = &DAT_001a7450;
  lVar5 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7ffc + lVar5);
    local_88._8_8_ = 1;
    local_78._0_8_ = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7410 + lVar5));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7430 + lVar5));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,*puVar4);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,1);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar5 = lVar5 + 4;
    puVar4 = puVar4 + 3;
  } while (lVar5 != 0x14);
  puVar6 = &DAT_001a7450;
  lVar5 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7ffc + lVar5);
    uVar1 = *puVar6;
    local_88._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar5) + 1;
    local_88._12_4_ = 0;
    local_78._0_8_ = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar5));
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7410 + lVar5));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7430 + lVar5));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar5 = lVar5 + 4;
    puVar6 = puVar6 + 3;
  } while (lVar5 != 0x14);
  piVar7 = (int *)&DAT_001a7454;
  lVar5 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7ffc + lVar5);
    uVar1 = piVar7[-1];
    local_88._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar5) + 1;
    local_88._12_4_ = 0;
    local_78._4_4_ = 1;
    local_78._0_4_ = *piVar7 + 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar5));
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7410 + lVar5));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7430 + lVar5));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar5 = lVar5 + 4;
    piVar7 = piVar7 + 3;
  } while (lVar5 != 0x14);
  puVar8 = &DAT_001a7454;
  lVar5 = 0;
  do {
    auVar2 = local_78;
    local_ac = *(undefined4 *)((long)&DAT_001a7ffc + lVar5);
    uVar1 = *(uint *)((long)puVar8 + -4);
    local_88._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar5) + 1;
    local_88._12_4_ = 0;
    local_78._4_4_ = (int)((ulong)*puVar8 >> 0x20) + 1;
    local_78._0_4_ = (int)*puVar8 + 1;
    local_78._8_8_ = auVar2._8_8_;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar5));
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7410 + lVar5));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,*(uint32_t *)((long)&DAT_001a7430 + lVar5));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x80000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar5 = lVar5 + 4;
    puVar8 = (undefined8 *)((long)puVar8 + 0xc);
  } while (lVar5 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileYsResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign[TEST_BPP_MAX] = {64, 32, 32, 32, 16};
    const uint32_t VAlign[TEST_BPP_MAX] = {32, 32, 32, 16, 16};

    const uint32_t TileSize[TEST_BPP_MAX][3] = {{64, 32, 32},
                                                {64, 32, 32},
                                                {128, 32, 16},
                                                {256, 16, 16},
                                                {256, 16, 16}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64));  // 1 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 2);  // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 4);  // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = TileSize[i][2] + 1;                      // 1 plane larger than 1 tile depth

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 8);   // 8 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}